

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmDsd.c
# Opt level: O0

void Mpm_ManPrintDsdStats(Mpm_Man_t *p)

{
  uint local_18;
  uint local_14;
  int Absent;
  int i;
  Mpm_Man_t *p_local;
  
  local_18 = 0;
  for (local_14 = 0; (int)local_14 < 0x253; local_14 = local_14 + 1) {
    if (p->nCountDsd[(int)local_14] == 0) {
      local_18 = local_18 + 1;
    }
    else if (p->pPars->fVeryVerbose != 0) {
      printf("%5d  :  ",(ulong)local_14);
      printf("%-20s   ",p->pDsd6[(int)local_14].pStr);
      printf("%8d ",(ulong)(uint)p->nCountDsd[(int)local_14]);
      printf("\n");
    }
  }
  printf("Unused classes = %d (%.2f %%).  ",((double)(int)local_18 * 100.0) / 595.0,(ulong)local_18)
  ;
  printf("Non-DSD cuts = %d (%.2f %%).  ",((double)p->nNonDsd * 100.0) / (double)p->nCutsMergedAll,
         (ulong)(uint)p->nNonDsd);
  printf("No-match cuts = %d (%.2f %%).\n",((double)p->nNoMatch * 100.0) / (double)p->nCutsMergedAll
         ,(ulong)(uint)p->nNoMatch);
  return;
}

Assistant:

void Mpm_ManPrintDsdStats( Mpm_Man_t * p )
{
    int i, Absent = 0;
    for ( i = 0; i < 595; i++ )
    {
        if ( p->nCountDsd[i] == 0 )
        {
            Absent++;
            continue;
        }
        if ( p->pPars->fVeryVerbose )
        {
            printf( "%5d  :  ", i );
            printf( "%-20s   ", p->pDsd6[i].pStr );
            printf( "%8d ",     p->nCountDsd[i] );
            printf( "\n" );
        }
    }
    printf( "Unused classes = %d (%.2f %%).  ",  Absent, 100.0 * Absent / 595 );
    printf( "Non-DSD cuts = %d (%.2f %%).  ",   p->nNonDsd, 100.0 * p->nNonDsd / p->nCutsMergedAll );
    printf( "No-match cuts = %d (%.2f %%).\n",  p->nNoMatch, 100.0 * p->nNoMatch / p->nCutsMergedAll );
}